

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall
PDA::Transducer::Grammar::Rule::Rule<wchar_t[6],wchar_t[5],wchar_t[1]>
          (Rule *this,wchar_t leftSide,wchar_t (*first) [6],wchar_t (*rest) [5],
          wchar_t (*rest_1) [1])

{
  wchar_t (*rest_local_1) [1];
  wchar_t (*rest_local) [5];
  wchar_t (*first_local) [6];
  wchar_t leftSide_local;
  Rule *this_local;
  
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  vector(&this->m_chains);
  std::__cxx11::wstring::wstring((wstring *)&this->m_errorString);
  this->m_left = leftSide;
  addChains<wchar_t[6],wchar_t[5],wchar_t[1]>(this,first,rest,rest_1);
  return;
}

Assistant:

Rule(const wchar_t leftSide, const First &first, const Rest&... rest)
        {
            m_left = leftSide;
            addChains(first, rest...);
        }